

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9AbsCreate(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  char *pcVar5;
  int iFlop;
  int fVerbose;
  int c;
  char *pFlopNum;
  char *pStr;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar2 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar2 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9AbsCreate(): There is no AIG.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        iVar2 = Gia_ManRegNum(pAbc->pGia);
        if (iVar2 == 0) {
          Abc_Print(-1,"The network is combinational.\n");
          pAbc_local._4_4_ = 0;
        }
        else if (pAbc->pGia->vFlopClasses == (Vec_Int_t *)0x0) {
          iVar2 = Gia_ManRegNum(pAbc->pGia);
          pVVar4 = Vec_IntStart(iVar2);
          pAbc->pGia->vFlopClasses = pVVar4;
          if (argc == globalUtilOptind + 1) {
            _fVerbose = strtok(argv[globalUtilOptind]," ,");
            while (_fVerbose != (char *)0x0) {
              iVar2 = atoi(_fVerbose);
              if ((iVar2 < 0) || (iVar3 = Gia_ManRegNum(pAbc->pGia), iVar3 <= iVar2)) {
                __assert_fail("iFlop >= 0 && iFlop < Gia_ManRegNum(pAbc->pGia)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abc.c"
                              ,0xb591,"int Abc_CommandAbc9AbsCreate(Abc_Frame_t *, int, char **)");
              }
              Vec_IntWriteEntry(pAbc->pGia->vFlopClasses,iVar2,1);
              _fVerbose = strtok((char *)0x0," ,");
            }
            pAbc_local._4_4_ = 0;
          }
          else {
            Abc_Print(-1,"Flop list should be specified on the command line.\n");
            pAbc_local._4_4_ = 0;
          }
        }
        else {
          Abc_Print(-1,"Abstraction flop map is already defined.\n");
          pAbc_local._4_4_ = 0;
        }
      }
      return pAbc_local._4_4_;
    }
    if ((iVar2 == 0x68) || (iVar2 != 0x76)) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  Abc_Print(-2,"usage: &abs_create [-vh] <comma-separated_list_of_zero-based_flop_ids>\n");
  Abc_Print(-2,"\t        creates new flop map by reading user\'s input\n");
  pcVar5 = "no";
  if (bVar1) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-v    : toggle printing verbose information [default = %s]\n",pcVar5);
  Abc_Print(-2,"\t-h    : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9AbsCreate( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    //Gia_Man_t * pTemp = NULL;
    char * pStr, * pFlopNum;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9AbsCreate(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( pAbc->pGia->vFlopClasses != NULL )
    {
        Abc_Print( -1, "Abstraction flop map is already defined.\n" );
        return 0;
    }
    pAbc->pGia->vFlopClasses = Vec_IntStart( Gia_ManRegNum(pAbc->pGia) );
    // read the flop list
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Flop list should be specified on the command line.\n" );
        return 0;
    }
    pStr = argv[globalUtilOptind];
    // parse flop list
    pFlopNum = strtok( pStr, " ," );
    while ( pFlopNum )
    {
        int iFlop = atoi(pFlopNum);
        assert( iFlop >= 0 && iFlop < Gia_ManRegNum(pAbc->pGia) );
        Vec_IntWriteEntry( pAbc->pGia->vFlopClasses, iFlop, 1 );
        pFlopNum = strtok( NULL, " ," );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &abs_create [-vh] <comma-separated_list_of_zero-based_flop_ids>\n" );
    Abc_Print( -2, "\t        creates new flop map by reading user's input\n" );
    Abc_Print( -2, "\t-v    : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}